

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  float *pfVar6;
  int iVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int extraout_EAX;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int q;
  int iVar21;
  int iVar22;
  size_type __n;
  ulong uVar23;
  int iVar24;
  long lVar25;
  int j;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_178;
  void *local_170;
  long local_138;
  Mat local_90;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar19 = bottom_blob->w;
  uVar2 = top_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar32 = true;
  }
  else {
    bVar32 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar24 = bottom_blob->c;
  uVar3 = top_blob->h;
  uVar12 = (ulong)uVar3;
  iVar21 = top_blob->c;
  uVar9 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar9;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,(allocator_type *)&local_90);
  iVar10 = 0;
  iVar7 = kernel_w;
  if (kernel_w < 1) {
    iVar7 = iVar10;
  }
  if (kernel_h < 1) {
    kernel_h = 0;
  }
  iVar18 = 0;
  iVar22 = 0;
  iVar14 = iVar7;
  for (; iVar10 != kernel_h; iVar10 = iVar10 + 1) {
    for (lVar25 = (long)iVar22; iVar14 != lVar25; lVar25 = lVar25 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar25] = iVar18;
      iVar18 = iVar18 + dilation_w;
    }
    iVar18 = iVar18 + (iVar19 * dilation_h - dilation_w * kernel_w);
    iVar14 = iVar14 + iVar7;
    iVar22 = iVar7 + iVar22;
  }
  if (iVar21 == group && iVar24 == group) {
    uVar31 = 0;
    if (0 < (int)uVar9) {
      uVar31 = (ulong)uVar9;
    }
    uVar23 = 0;
    if (0 < (int)uVar2) {
      uVar23 = (ulong)uVar2;
    }
    if ((int)uVar3 < 1) {
      uVar12 = 0;
    }
    local_178 = 0;
    if (group < 1) {
      group = 0;
    }
    for (uVar27 = 0; uVar27 != (uint)group; uVar27 = uVar27 + 1) {
      Mat::channel(&local_90,top_blob,(int)uVar27);
      pvVar29 = local_90.data;
      Mat::~Mat(&local_90);
      pvVar4 = weight_data->data;
      Mat::channel(&local_90,bottom_blob,(int)uVar27);
      for (uVar16 = 0; pvVar8 = local_90.data, uVar16 != uVar12; uVar16 = uVar16 + 1) {
        pvVar5 = bias_data->data;
        lVar25 = (long)local_90.w * uVar16 * (long)stride_h * local_90.elemsize;
        pfVar6 = (float *)activation_params->data;
        for (uVar26 = 0; uVar26 != uVar23; uVar26 = uVar26 + 1) {
          fVar36 = 0.0;
          if (!bVar32) {
            fVar36 = *(float *)((long)pvVar5 + uVar27 * 4);
          }
          for (uVar15 = 0; uVar31 != uVar15; uVar15 = uVar15 + 1) {
            fVar36 = fVar36 + *(float *)((long)pvVar4 + uVar15 * 4 + local_178) *
                              *(float *)((long)pvVar8 +
                                        (long)local_48._M_impl.super__Vector_impl_data._M_start
                                              [uVar15] * 4 + uVar26 * (long)stride_w * 4 + lVar25);
          }
          fVar33 = fVar36;
          switch(activation_type) {
          case 1:
            if (fVar36 <= 0.0) {
              fVar33 = 0.0;
            }
            break;
          case 2:
            fVar33 = (float)(~-(uint)(0.0 < fVar36) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
            break;
          case 3:
            if (fVar36 <= *pfVar6) {
              fVar36 = *pfVar6;
            }
            fVar33 = fVar36;
            if (pfVar6[1] <= fVar36) {
              fVar33 = pfVar6[1];
            }
            break;
          case 4:
            fVar36 = expf(-fVar36);
            fVar33 = 1.0 / (fVar36 + 1.0);
            break;
          case 5:
            fVar33 = expf(fVar36);
            fVar33 = logf(fVar33 + 1.0);
            fVar33 = tanhf(fVar33);
            fVar33 = fVar33 * fVar36;
            break;
          case 6:
            fVar1 = *pfVar6;
            fVar34 = -pfVar6[1] / fVar1;
            fVar33 = 0.0;
            if ((fVar34 <= fVar36) && (fVar33 = fVar36, fVar36 <= fVar34 + 1.0 / fVar1)) {
              fVar33 = (fVar1 * fVar36 + pfVar6[1]) * fVar36;
            }
          }
          *(float *)((long)pvVar29 + uVar26 * 4) = fVar33;
        }
        pvVar29 = (void *)((long)pvVar29 + (long)(int)uVar2 * 4);
      }
      Mat::~Mat(&local_90);
      local_178 = local_178 + __n * 4;
    }
  }
  else {
    iVar24 = iVar24 / group;
    uVar11 = iVar21 / group;
    uVar31 = 0;
    if (0 < (int)uVar9) {
      uVar31 = (ulong)uVar9;
    }
    iVar19 = 0;
    if (0 < iVar24) {
      iVar19 = iVar24;
    }
    uVar23 = 0;
    if (0 < (int)uVar2) {
      uVar23 = (ulong)uVar2;
    }
    if ((int)uVar3 < 1) {
      uVar12 = 0;
    }
    uVar27 = 0;
    if (0 < (int)uVar11) {
      uVar27 = (ulong)uVar11;
    }
    uVar26 = 0;
    uVar16 = (ulong)(uint)group;
    if (group < 1) {
      uVar16 = uVar26;
    }
    for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      local_138 = (long)(int)uVar26 << 2;
      for (uVar20 = 0; uVar20 != uVar27; uVar20 = uVar20 + 1) {
        lVar25 = uVar20 + uVar15 * (long)(int)uVar11;
        Mat::channel(&local_90,top_blob,(int)lVar25);
        local_170 = local_90.data;
        Mat::~Mat(&local_90);
        pvVar29 = weight_data->data;
        for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
          for (uVar30 = 0; uVar30 != uVar23; uVar30 = uVar30 + 1) {
            fVar36 = 0.0;
            if (!bVar32) {
              fVar36 = *(float *)((long)bias_data->data + lVar25 * 4);
            }
            lVar28 = (long)pvVar29 + local_138;
            for (iVar21 = 0; iVar21 != iVar19; iVar21 = iVar21 + 1) {
              Mat::channel(&local_90,bottom_blob,iVar24 * (int)uVar15 + iVar21);
              for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                fVar36 = fVar36 + *(float *)(lVar28 + uVar17 * 4) *
                                  *(float *)((long)local_90.data +
                                            (long)local_48._M_impl.super__Vector_impl_data._M_start
                                                  [uVar17] * 4 +
                                            uVar30 * (long)stride_w * 4 +
                                            (long)local_90.w * uVar13 * (long)stride_h *
                                            local_90.elemsize);
              }
              Mat::~Mat(&local_90);
              lVar28 = lVar28 + __n * 4;
            }
            fVar33 = fVar36;
            switch(activation_type) {
            case 1:
              if (fVar36 <= 0.0) {
                fVar33 = 0.0;
              }
              break;
            case 2:
              fVar33 = (float)(~-(uint)(0.0 < fVar36) & *activation_params->data |
                              -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
              break;
            case 3:
              fVar33 = *activation_params->data;
              if (fVar36 <= fVar33) {
                fVar36 = fVar33;
              }
              fVar1 = *(float *)((long)activation_params->data + 4);
              fVar33 = fVar36;
              if (fVar1 <= fVar36) {
                fVar33 = fVar1;
              }
              break;
            case 4:
              fVar36 = expf(-fVar36);
              fVar33 = 1.0 / (fVar36 + 1.0);
              break;
            case 5:
              fVar33 = expf(fVar36);
              fVar33 = logf(fVar33 + 1.0);
              fVar33 = tanhf(fVar33);
              fVar33 = fVar33 * fVar36;
              break;
            case 6:
              fVar1 = *activation_params->data;
              fVar34 = *(float *)((long)activation_params->data + 4);
              fVar35 = -fVar34 / fVar1;
              fVar33 = 0.0;
              if ((fVar35 <= fVar36) && (fVar33 = fVar36, fVar36 <= fVar35 + 1.0 / fVar1)) {
                fVar33 = (fVar1 * fVar36 + fVar34) * fVar36;
              }
            }
            *(float *)((long)local_170 + uVar30 * 4) = fVar33;
          }
          local_170 = (void *)((long)local_170 + (long)(int)uVar2 * 4);
        }
        local_138 = local_138 + (long)(int)(iVar24 * uVar9) * 4;
      }
      uVar26 = (ulong)((int)uVar26 + uVar11 * iVar24 * uVar9);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
#endif

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}